

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

void __thiscall Board::Board(Board *this)

{
  initializer_list<Ship> __l;
  Ship local_104;
  undefined1 local_ec;
  undefined4 local_e8;
  undefined1 local_d4;
  undefined4 local_d0;
  undefined1 local_bc;
  undefined4 local_b8;
  undefined1 local_a4;
  undefined4 local_a0;
  undefined1 local_8c;
  undefined4 local_88;
  undefined1 local_74;
  undefined4 local_70;
  undefined1 local_5c;
  undefined4 local_58;
  undefined1 local_44;
  undefined4 local_40;
  undefined1 local_2c;
  undefined4 local_28;
  allocator_type local_11;
  
  local_104.ID = 'B';
  local_104.length = 4;
  local_ec = 0x44;
  local_e8 = 3;
  local_d4 = 0x44;
  local_d0 = 3;
  local_bc = 0x43;
  local_b8 = 2;
  local_a4 = 0x43;
  local_a0 = 2;
  local_8c = 0x43;
  local_88 = 2;
  local_74 = 0x53;
  local_70 = 1;
  local_5c = 0x53;
  local_58 = 1;
  local_44 = 0x53;
  local_40 = 1;
  local_2c = 0x53;
  local_28 = 1;
  __l._M_len = 10;
  __l._M_array = &local_104;
  std::vector<Ship,_std::allocator<Ship>_>::vector(&this->armada,__l,&local_11);
  (this->matrix).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->matrix).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->row = 0;
  this->column = 0;
  (this->matrix).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

Board(void) 
        {
          row = 0;
          column = 0;
        }